

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O0

void __thiscall
Rml::ElementFormControlTextArea::OnPropertyChange
          (ElementFormControlTextArea *this,PropertyIdSet *changed_properties)

{
  _WordT this_00;
  bool bVar1;
  PropertyIdSet *this_01;
  PropertyIdSet *other;
  WidgetTextInput *pWVar2;
  PropertyIdSet local_38;
  undefined1 local_28 [8];
  PropertyIdSet changed_inherited_layout_properties;
  PropertyIdSet *changed_properties_local;
  ElementFormControlTextArea *this_local;
  
  changed_inherited_layout_properties.defined_ids.super__Base_bitset<2UL>._M_w[1] =
       (_WordT)changed_properties;
  Element::OnPropertyChange((Element *)this,changed_properties);
  this_00 = changed_inherited_layout_properties.defined_ids.super__Base_bitset<2UL>._M_w[1];
  this_01 = StyleSheetSpecification::GetRegisteredInheritedProperties();
  other = StyleSheetSpecification::GetRegisteredPropertiesForcingLayout();
  local_38 = PropertyIdSet::operator&(this_01,other);
  _local_28 = (_WordT  [2])PropertyIdSet::operator&((PropertyIdSet *)this_00,&local_38);
  bVar1 = PropertyIdSet::Empty((PropertyIdSet *)local_28);
  if (!bVar1) {
    pWVar2 = &::std::
              unique_ptr<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
              ::operator->(&this->widget)->super_WidgetTextInput;
    WidgetTextInput::ForceFormattingOnNextLayout(pWVar2);
  }
  bVar1 = PropertyIdSet::Contains
                    ((PropertyIdSet *)
                     changed_inherited_layout_properties.defined_ids.super__Base_bitset<2UL>._M_w[1]
                     ,Color);
  if ((bVar1) ||
     (bVar1 = PropertyIdSet::Contains
                        ((PropertyIdSet *)
                         changed_inherited_layout_properties.defined_ids.super__Base_bitset<2UL>.
                         _M_w[1],BackgroundColor), bVar1)) {
    pWVar2 = &::std::
              unique_ptr<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
              ::operator->(&this->widget)->super_WidgetTextInput;
    WidgetTextInput::UpdateSelectionColours(pWVar2);
  }
  bVar1 = PropertyIdSet::Contains
                    ((PropertyIdSet *)
                     changed_inherited_layout_properties.defined_ids.super__Base_bitset<2UL>._M_w[1]
                     ,CaretColor);
  if (bVar1) {
    pWVar2 = &::std::
              unique_ptr<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
              ::operator->(&this->widget)->super_WidgetTextInput;
    WidgetTextInput::GenerateCursor(pWVar2);
  }
  return;
}

Assistant:

void ElementFormControlTextArea::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	ElementFormControl::OnPropertyChange(changed_properties);

	// Some inherited properties require text formatting update, mainly font and line-height properties.
	const PropertyIdSet changed_inherited_layout_properties = changed_properties &
		(StyleSheetSpecification::GetRegisteredInheritedProperties() & StyleSheetSpecification::GetRegisteredPropertiesForcingLayout());

	if (!changed_inherited_layout_properties.Empty())
		widget->ForceFormattingOnNextLayout();

	if (changed_properties.Contains(PropertyId::Color) || changed_properties.Contains(PropertyId::BackgroundColor))
		widget->UpdateSelectionColours();

	if (changed_properties.Contains(PropertyId::CaretColor))
		widget->GenerateCursor();
}